

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

bool __thiscall
ddd::DictionarySGL<false,_true>::insert_key
          (DictionarySGL<false,_true> *this,char *key,uint32_t value)

{
  uint32_t in_EDX;
  char *in_RSI;
  long in_RDI;
  Query query;
  Query *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  Query local_38;
  uint32_t local_1c;
  byte local_1;
  
  if ((int)in_EDX < 0) {
    __assert_fail("(value >> 31) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DictionarySGL.hpp"
                  ,0x25,
                  "virtual bool ddd::DictionarySGL<false, true>::insert_key(const char *, uint32_t) [WithBLM = false, WithNLM = true]"
                 );
  }
  this_00 = &local_38;
  local_1c = in_EDX;
  Query::Query(this_00,in_RSI);
  Query::set_value(this_00,local_1c);
  std::
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                *)0x166f79);
  local_1 = DaTrie<false,_true,_false>::insert_key
                      ((DaTrie<false,_true,_false> *)
                       CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),this_00);
  if ((bool)local_1) {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
  }
  Query::~Query(&local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool insert_key(const char* key, uint32_t value) {
    assert((value >> 31) == 0);

    Query query(key);
    query.set_value(value);
    if (!trie_->insert_key(query)) {
      return false;
    }
    ++num_keys_;
    return true;
  }